

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

bool EthBasePort::CheckDebugHeader(ostream *debugStream,string *caller,char *header,uint version)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  uint debugLevel;
  uint version_local;
  char *header_local;
  string *caller_local;
  ostream *debugStream_local;
  
  iVar1 = strncmp(header,"DBG",3);
  if (iVar1 == 0) {
    uVar2 = (int)header[3] - 0x30;
    if (uVar2 == 0) {
      poVar3 = std::operator<<(debugStream,(string *)caller);
      poVar3 = std::operator<<(poVar3,": No debug data available");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      debugStream_local._7_1_ = false;
    }
    else if (uVar2 == version) {
      debugStream_local._7_1_ = true;
    }
    else {
      poVar3 = std::operator<<(debugStream,(string *)caller);
      poVar3 = std::operator<<(poVar3,": Unsupported debug level: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
      poVar3 = std::operator<<(poVar3," (must be ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,version);
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      debugStream_local._7_1_ = false;
    }
  }
  else {
    poVar3 = std::operator<<(debugStream,(string *)caller);
    poVar3 = std::operator<<(poVar3,": Unexpected header string: ");
    poVar3 = std::operator<<(poVar3,*header);
    poVar3 = std::operator<<(poVar3,header[1]);
    poVar3 = std::operator<<(poVar3,header[2]);
    poVar3 = std::operator<<(poVar3," (should be DBG)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    debugStream_local._7_1_ = false;
  }
  return debugStream_local._7_1_;
}

Assistant:

bool EthBasePort::CheckDebugHeader(std::ostream &debugStream, const std::string &caller, const char *header,
                                   unsigned int version)
{
    if (strncmp(header, "DBG", 3) != 0) {
        debugStream << caller << ": Unexpected header string: " << header[0] << header[1]
                    << header[2] << " (should be DBG)" << std::endl;
        return false;
    }
    unsigned int debugLevel = header[3] - '0';
    if (debugLevel == 0) {
        debugStream << caller << ": No debug data available" << std::endl;
        return false;
    }
    // Introduced debugLevel 2 with Firmware V8. Use an older version of this software for
    // earlier versions of firmware.
    else if (debugLevel != version) {
        debugStream << caller << ": Unsupported debug level: " << debugLevel << " (must be "
                    << version << ")" << std::endl;
        return false;
    }
    return true;
}